

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O0

ngram_model_t *
ngram_model_set_init
          (ps_config_t *config,ngram_model_t **models,char **names,float32 *weights,int32 n_models)

{
  logmath_t *lmath_00;
  int iVar1;
  int iVar2;
  uint32 *puVar3;
  void *pvVar4;
  ngram_model_t *pnVar5;
  char *pcVar6;
  float64 fVar7;
  float64 fVar8;
  uint local_58;
  int32 uniform;
  int32 n;
  int32 i;
  logmath_t *lmath;
  ngram_model_t *base;
  ngram_model_set_t *model;
  int32 n_models_local;
  float32 *weights_local;
  char **names_local;
  ngram_model_t **models_local;
  ps_config_t *config_local;
  
  if (n_models == 0) {
    config_local = (ps_config_t *)0x0;
  }
  else {
    lmath_00 = (*models)->lmath;
    for (uniform = 1; uniform < n_models; uniform = uniform + 1) {
      fVar7 = logmath_get_base(models[uniform]->lmath);
      fVar8 = logmath_get_base(lmath_00);
      if (((double)fVar7 != (double)fVar8) || (NAN((double)fVar7) || NAN((double)fVar8))) {
LAB_0014373e:
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                ,0x91,"Log-math parameters don\'t match, will not create LM set\n");
        return (ngram_model_t *)0x0;
      }
      iVar1 = logmath_get_shift(models[uniform]->lmath);
      iVar2 = logmath_get_shift(lmath_00);
      if (iVar1 != iVar2) goto LAB_0014373e;
    }
    config_local = (ps_config_t *)
                   __ckd_calloc__(1,0x90,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                                  ,0x97);
    ((ngram_model_t *)((long)config_local + 0x60))->refcount = n_models;
    puVar3 = (uint32 *)
             __ckd_calloc__((long)n_models,8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                            ,0x9a);
    ((ngram_model_t *)((long)config_local + 0x60))->n_counts = puVar3;
    pvVar4 = __ckd_calloc__((long)n_models,8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                            ,0x9b);
    *(void **)&((ngram_model_t *)((long)config_local + 0x60))->n_1g_alloc = pvVar4;
    pvVar4 = __ckd_calloc__((long)n_models,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                            ,0x9d);
    *(void **)&((ngram_model_t *)((long)config_local + 0x60))->n = pvVar4;
    iVar1 = logmath_log(lmath_00,(float64)(1.0 / (double)n_models));
    for (uniform = 0; uniform < n_models; uniform = uniform + 1) {
      *(int *)(*(long *)&((ngram_model_t *)((long)config_local + 0x60))->n + (long)uniform * 4) =
           iVar1;
    }
    if (weights != (float32 *)0x0) {
      *(undefined4 *)&((ngram_model_t *)((long)config_local + 0x60))->field_0x4 = 0xffffffff;
    }
    local_58 = 0;
    for (uniform = 0; uniform < n_models; uniform = uniform + 1) {
      pnVar5 = ngram_model_retain(models[uniform]);
      *(ngram_model_t **)
       (((ngram_model_t *)((long)config_local + 0x60))->n_counts + (long)uniform * 2) = pnVar5;
      pcVar6 = __ckd_salloc__(names[uniform],
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                              ,0xaa);
      *(char **)(*(long *)&((ngram_model_t *)((long)config_local + 0x60))->n_1g_alloc +
                (long)uniform * 8) = pcVar6;
      if (weights != (float32 *)0x0) {
        iVar1 = logmath_log(lmath_00,(float64)(double)(float)weights[uniform]);
        *(int *)(*(long *)&((ngram_model_t *)((long)config_local + 0x60))->n + (long)uniform * 4) =
             iVar1;
      }
      if (local_58 < models[uniform]->n) {
        local_58 = (uint)models[uniform]->n;
      }
    }
    pvVar4 = __ckd_calloc__((long)(int)(local_58 - 1),4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                            ,0xb2);
    *(void **)&((ngram_model_t *)((long)config_local + 0x60))->lw = pvVar4;
    build_widmap((ngram_model_t *)config_local,lmath_00,local_58);
  }
  return (ngram_model_t *)config_local;
}

Assistant:

ngram_model_t *
ngram_model_set_init(ps_config_t * config,
                     ngram_model_t ** models,
                     char **names, const float32 * weights, int32 n_models)
{
    ngram_model_set_t *model;
    ngram_model_t *base;
    logmath_t *lmath;
    int32 i, n;

    (void)config;
    if (n_models == 0)          /* WTF */
        return NULL;

    /* Do consistency checking on the models.  They must all use the
     * same logbase and shift. */
    lmath = models[0]->lmath;
    for (i = 1; i < n_models; ++i) {
        if (logmath_get_base(models[i]->lmath) != logmath_get_base(lmath)
            || logmath_get_shift(models[i]->lmath) !=
            logmath_get_shift(lmath)) {
            E_ERROR
                ("Log-math parameters don't match, will not create LM set\n");
            return NULL;
        }
    }

    /* Allocate the combined model, initialize it. */
    model = ckd_calloc(1, sizeof(*model));
    base = &model->base;
    model->n_models = n_models;
    model->lms = ckd_calloc(n_models, sizeof(*model->lms));
    model->names = ckd_calloc(n_models, sizeof(*model->names));
    /* Initialize weights to a uniform distribution */
    model->lweights = ckd_calloc(n_models, sizeof(*model->lweights));
    {
        int32 uniform = logmath_log(lmath, 1.0 / n_models);
        for (i = 0; i < n_models; ++i)
            model->lweights[i] = uniform;
    }
    /* Default to interpolate if weights were given. */
    if (weights)
        model->cur = -1;

    n = 0;
    for (i = 0; i < n_models; ++i) {
        model->lms[i] = ngram_model_retain(models[i]);
        model->names[i] = ckd_salloc(names[i]);
        if (weights)
            model->lweights[i] = logmath_log(lmath, weights[i]);
        /* N is the maximum of all merged models. */
        if (models[i]->n > n)
            n = models[i]->n;
    }
    /* Allocate the history mapping table. */
    model->maphist = ckd_calloc(n - 1, sizeof(*model->maphist));

    /* Now build the word-ID mapping and merged vocabulary. */
    build_widmap(base, lmath, n);
    return base;
}